

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void SkipMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                    UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  uint uVar1;
  CLzRef *pCVar2;
  uint local_70;
  UInt32 local_6c;
  UInt32 len;
  Byte *pb;
  CLzRef *pair;
  UInt32 delta;
  UInt32 len1;
  UInt32 len0;
  CLzRef *ptr1;
  CLzRef *ptr0;
  UInt32 _cyclicBufferPos_local;
  CLzRef *son_local;
  Byte *cur_local;
  UInt32 pos_local;
  UInt32 curMatch_local;
  UInt32 lenLimit_local;
  
  ptr1 = son + (_cyclicBufferPos << 1);
  len0 = 0;
  len1 = 0;
  ptr0 = son + (ulong)(_cyclicBufferPos << 1) + 1;
  curMatch_local = curMatch;
  do {
    uVar1 = pos - curMatch_local;
    if ((cutValue == 0) || (_cyclicBufferSize <= uVar1)) {
      *ptr1 = 0;
      *ptr0 = 0;
      return;
    }
    if (_cyclicBufferPos < uVar1) {
      local_6c = _cyclicBufferSize;
    }
    else {
      local_6c = 0;
    }
    pCVar2 = son + ((_cyclicBufferPos - uVar1) + local_6c) * 2;
    if (len0 < len1) {
      local_70 = len0;
    }
    else {
      local_70 = len1;
    }
    len = local_70;
    if (cur[(ulong)local_70 - (ulong)uVar1] == cur[local_70]) {
      do {
        len = len + 1;
        if (len == lenLimit) break;
      } while (cur[(ulong)len - (ulong)uVar1] == cur[len]);
      if (len == lenLimit) {
        *ptr1 = *pCVar2;
        *ptr0 = pCVar2[1];
        return;
      }
    }
    if (cur[(ulong)len - (ulong)uVar1] < cur[len]) {
      *ptr1 = curMatch_local;
      ptr1 = pCVar2 + 1;
      curMatch_local = *ptr1;
      len1 = len;
      cutValue = cutValue - 1;
    }
    else {
      *ptr0 = curMatch_local;
      curMatch_local = *pCVar2;
      len0 = len;
      cutValue = cutValue - 1;
      ptr0 = pCVar2;
    }
  } while( true );
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue)
{
  CLzRef *ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;)
  {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
    {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return;
    }
    {
      CLzRef *pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}